

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O0

void __thiscall duckdb::ParquetReader::InitializeSchema(ParquetReader *this,ClientContext *context)

{
  undefined8 uVar1;
  string *psVar2;
  size_type sVar3;
  pointer pPVar4;
  BaseFileReader *in_RDI;
  ParquetColumnSchema *in_stack_00000018;
  FileMetaData *in_stack_00000020;
  ParquetReader *in_stack_00000028;
  value_type *element;
  idx_t i;
  ParquetReader *in_stack_000000f8;
  FileMetaData *file_meta_data;
  value_type *in_stack_fffffffffffffe38;
  MultiFileColumnDefinition *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  InvalidInputException *in_stack_fffffffffffffeb0;
  ulong local_d8;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  undefined1 local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  FileMetaData *local_18;
  
  local_18 = GetFileMetadata((ParquetReader *)0x69c399);
  if ((((byte)local_18->__isset >> 3 & 1) != 0) &&
     (((byte)(local_18->encryption_algorithm).__isset >> 1 & 1) != 0)) {
    local_71 = 1;
    uVar1 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "File \'%s\' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
               &local_39);
    psVar2 = BaseFileReader::GetFileName_abi_cxx11_(in_RDI);
    std::__cxx11::string::string(local_70,(string *)psVar2);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    local_71 = 0;
    __cxa_throw(uVar1,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  sVar3 = std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
          ::size(&(local_18->schema).
                  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                );
  if (1 < sVar3) {
    ParseSchema(in_stack_000000f8);
    unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
    ::operator=((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
                 *)in_stack_fffffffffffffe40,
                (unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
                 *)in_stack_fffffffffffffe38);
    unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
    ::~unique_ptr((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
                   *)0x69c683);
    local_d8 = 0;
    while( true ) {
      pPVar4 = unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
               ::operator->((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
                             *)in_stack_fffffffffffffe40);
      sVar3 = std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
              ::size(&(pPVar4->children).
                      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                    );
      if (sVar3 <= local_d8) break;
      unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
      ::operator->((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
                    *)in_stack_fffffffffffffe40);
      vector<duckdb::ParquetColumnSchema,_true>::operator[]
                ((vector<duckdb::ParquetColumnSchema,_true> *)in_stack_fffffffffffffe40,
                 (size_type)in_stack_fffffffffffffe38);
      in_stack_fffffffffffffe38 = (value_type *)&in_RDI->columns;
      in_stack_fffffffffffffe40 = (MultiFileColumnDefinition *)&stack0xfffffffffffffe88;
      ParseColumnDefinition(in_stack_00000028,in_stack_00000020,in_stack_00000018);
      std::
      vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ::push_back((vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                   *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      MultiFileColumnDefinition::~MultiFileColumnDefinition(in_stack_fffffffffffffe40);
      local_d8 = local_d8 + 1;
    }
    return;
  }
  uVar1 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,
             "Failed to read Parquet file \'%s\': Need at least one non-root column in the file",
             &local_99);
  psVar2 = BaseFileReader::GetFileName_abi_cxx11_(in_RDI);
  std::__cxx11::string::string(local_c0,(string *)psVar2);
  InvalidInputException::InvalidInputException<std::__cxx11::string>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  __cxa_throw(uVar1,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
}

Assistant:

void ParquetReader::InitializeSchema(ClientContext &context) {
	auto file_meta_data = GetFileMetadata();

	if (file_meta_data->__isset.encryption_algorithm) {
		if (file_meta_data->encryption_algorithm.__isset.AES_GCM_CTR_V1) {
			throw InvalidInputException("File '%s' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
			                            GetFileName());
		}
	}
	// check if we like this schema
	if (file_meta_data->schema.size() < 2) {
		throw InvalidInputException("Failed to read Parquet file '%s': Need at least one non-root column in the file",
		                            GetFileName());
	}
	root_schema = ParseSchema();
	for (idx_t i = 0; i < root_schema->children.size(); i++) {
		auto &element = root_schema->children[i];
		columns.push_back(ParseColumnDefinition(*file_meta_data, element));
	}
}